

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.c
# Opt level: O1

int elf_fetch_backward_init(uchar **ppin,uchar *pinend,uint64_t *pval,uint *pbits)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  byte *pbVar4;
  uint uVar5;
  ulong uVar6;
  byte *pbVar7;
  
  pbVar4 = *ppin;
  bVar1 = *pbVar4;
  if (bVar1 == 0) {
    iVar3 = 0;
  }
  else {
    if (((ulong)pbVar4 & 3) == 0) {
      uVar5 = 8;
      uVar6 = 0;
    }
    else {
      iVar3 = (int)pbVar4;
      uVar6 = 0;
      pbVar7 = pbVar4;
      do {
        pbVar7 = pbVar7 + -1;
        uVar6 = (ulong)*pbVar4 | uVar6 << 8;
        pbVar4 = pbVar4 + -1;
      } while (((ulong)pbVar7 & 3) != 0);
      uVar6 = uVar6 << 8;
      uVar5 = (iVar3 * 8 + 0x18U & 0x18) + 0x10;
    }
    bVar2 = *pbVar4;
    *ppin = pbVar4;
    *pval = bVar2 | uVar6;
    *pbits = uVar5;
    elf_fetch_bits_backward(ppin,pinend,pval,pbits);
    uVar5 = 0x1f;
    if (bVar1 != 0) {
      for (; bVar1 >> uVar5 == 0; uVar5 = uVar5 - 1) {
      }
    }
    *pbits = (*pbits - (uVar5 ^ 0x1f)) + 0x17;
    elf_fetch_bits_backward(ppin,pinend,pval,pbits);
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

static int
elf_fetch_backward_init (const unsigned char **ppin,
			 const unsigned char *pinend,
			 uint64_t *pval, unsigned int *pbits)
{
  const unsigned char *pin;
  unsigned int stream_start;
  uint64_t val;
  unsigned int bits;

  pin = *ppin;
  stream_start = (unsigned int)*pin;
  if (unlikely (stream_start == 0))
    {
      elf_uncompress_failed ();
      return 0;
    }
  val = 0;
  bits = 0;

  /* Align to a 32-bit boundary.  */
  while ((((uintptr_t)pin) & 3) != 0)
    {
      val <<= 8;
      val |= (uint64_t)*pin;
      bits += 8;
      --pin;
    }

  val <<= 8;
  val |= (uint64_t)*pin;
  bits += 8;

  *ppin = pin;
  *pval = val;
  *pbits = bits;
  if (!elf_fetch_bits_backward (ppin, pinend, pval, pbits))
    return 0;

  *pbits -= __builtin_clz (stream_start) - (sizeof (unsigned int) - 1) * 8 + 1;

  if (!elf_fetch_bits_backward (ppin, pinend, pval, pbits))
    return 0;

  return 1;
}